

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_encoder_isac_t_impl.h
# Opt level: O3

void __thiscall
webrtc::AudioEncoderIsacT<webrtc::IsacFloat>::RecreateEncoderInstance
          (AudioEncoderIsacT<webrtc::IsacFloat> *this,Config *config)

{
  instance_type **ISAC_main_inst;
  LockedIsacBandwidthInfo *pLVar1;
  LockedIsacBandwidthInfo *pLVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  string *result;
  ostream *poVar8;
  int iVar9;
  int32_t bottleneckBPS;
  int16_t local_192;
  FatalMessage local_190;
  
  bVar7 = Config::IsOk(config);
  if (!bVar7) {
    rtc::FatalMessage::FatalMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/audio_encoder_isac_t_impl.h"
               ,0x9e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190,"Check failed: config.IsOk()",0x1b);
    std::ios::widen((char)(ostream *)&local_190 +
                    (char)*(undefined8 *)(CONCAT44(local_190._4_4_,local_190._0_4_) + -0x18));
    std::ostream::put((char)&local_190);
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"# ",2);
    rtc::FatalMessage::~FatalMessage(&local_190);
  }
  this->packet_in_progress_ = false;
  pLVar1 = (config->bwinfo).ptr_;
  if (pLVar1 != (LockedIsacBandwidthInfo *)0x0) {
    LOCK();
    pLVar1->ref_count_ = pLVar1->ref_count_ + 1;
    UNLOCK();
  }
  pLVar2 = (this->bwinfo_).ptr_;
  if (pLVar2 != (LockedIsacBandwidthInfo *)0x0) {
    LockedIsacBandwidthInfo::Release(pLVar2);
  }
  (this->bwinfo_).ptr_ = pLVar1;
  if (this->isac_state_ != (ISACStruct *)0x0) {
    local_190._0_4_ = 0;
    local_192 = WebRtcIsac_Free(this->isac_state_);
    if (local_192 != 0) {
      result = rtc::MakeCheckOpString<int,short>
                         ((int *)&local_190,&local_192,"0 == T::Free(isac_state_)");
      if (result != (string *)0x0) {
        iVar9 = 0xa2;
        goto LAB_00150ec1;
      }
    }
  }
  ISAC_main_inst = &this->isac_state_;
  local_190._0_4_ = 0;
  local_192 = WebRtcIsac_Create(ISAC_main_inst);
  if (local_190._0_4_ != (int)local_192) {
    result = rtc::MakeCheckOpString<int,short>
                       ((int *)&local_190,&local_192,"0 == T::Create(&isac_state_)");
    if (result != (string *)0x0) {
      iVar9 = 0xa3;
      goto LAB_00150ec1;
    }
  }
  local_190._0_4_ = 0;
  local_192 = WebRtcIsac_EncoderInit(*ISAC_main_inst,config->adaptive_mode ^ 1);
  if (local_190._0_4_ != (int)local_192) {
    result = rtc::MakeCheckOpString<int,short>
                       ((int *)&local_190,&local_192,
                        "0 == T::EncoderInit(isac_state_, config.adaptive_mode ? 0 : 1)");
    if (result != (string *)0x0) {
      iVar9 = 0xa4;
      goto LAB_00150ec1;
    }
  }
  local_190._0_4_ = 0;
  local_192 = WebRtcIsac_SetEncSampRate(*ISAC_main_inst,(uint16_t)config->sample_rate_hz);
  if (local_192 != 0) {
    result = rtc::MakeCheckOpString<int,short>
                       ((int *)&local_190,&local_192,
                        "0 == T::SetEncSampRate(isac_state_, config.sample_rate_hz)");
    if (result != (string *)0x0) {
      iVar9 = 0xa5;
      goto LAB_00150ec1;
    }
  }
  bottleneckBPS = 32000;
  if (config->bit_rate != 0) {
    bottleneckBPS = config->bit_rate;
  }
  if (config->adaptive_mode == true) {
    local_190._0_4_ = 0;
    local_192 = WebRtcIsac_ControlBwe
                          (*ISAC_main_inst,bottleneckBPS,config->frame_size_ms,
                           (ushort)config->enforce_frame_size);
    if (local_192 != 0) {
      result = rtc::MakeCheckOpString<int,short>
                         ((int *)&local_190,&local_192,
                          "0 == T::ControlBwe(isac_state_, bit_rate, config.frame_size_ms, config.enforce_frame_size)"
                         );
      if (result != (string *)0x0) {
        iVar9 = 0xa9;
        goto LAB_00150ec1;
      }
    }
  }
  else {
    local_190._0_4_ = 0;
    local_192 = WebRtcIsac_Control(*ISAC_main_inst,bottleneckBPS,config->frame_size_ms);
    if (local_192 != 0) {
      result = rtc::MakeCheckOpString<int,short>
                         ((int *)&local_190,&local_192,
                          "0 == T::Control(isac_state_, bit_rate, config.frame_size_ms)");
      if (result != (string *)0x0) {
        iVar9 = 0xab;
        goto LAB_00150ec1;
      }
    }
  }
  if (config->max_payload_size_bytes != -1) {
    local_190._0_4_ = 0;
    local_192 = WebRtcIsac_SetMaxPayloadSize
                          (*ISAC_main_inst,(int16_t)config->max_payload_size_bytes);
    if (local_192 != 0) {
      result = rtc::MakeCheckOpString<int,short>
                         ((int *)&local_190,&local_192,
                          "0 == T::SetMaxPayloadSize(isac_state_, config.max_payload_size_bytes)");
      if (result != (string *)0x0) {
        iVar9 = 0xaf;
        goto LAB_00150ec1;
      }
    }
  }
  if (config->max_bit_rate != -1) {
    local_190._0_4_ = 0;
    local_192 = WebRtcIsac_SetMaxRate(*ISAC_main_inst,config->max_bit_rate);
    if (local_192 != 0) {
      result = rtc::MakeCheckOpString<int,short>
                         ((int *)&local_190,&local_192,
                          "0 == T::SetMaxRate(isac_state_, config.max_bit_rate)");
      if (result != (string *)0x0) {
        iVar9 = 0xb1;
        goto LAB_00150ec1;
      }
    }
  }
  local_190._0_4_ = 0;
  local_192 = WebRtcIsac_SetDecSampRate(*ISAC_main_inst,(uint16_t)config->sample_rate_hz);
  if (local_192 != 0) {
    result = rtc::MakeCheckOpString<int,short>
                       ((int *)&local_190,&local_192,
                        "0 == T::SetDecSampRate(isac_state_, config.sample_rate_hz)");
    if (result != (string *)0x0) {
      iVar9 = 0xb7;
LAB_00150ec1:
      rtc::FatalMessage::FatalMessage
                (&local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/audio_encoder_isac_t_impl.h"
                 ,iVar9,result);
      rtc::FatalMessage::~FatalMessage(&local_190);
    }
  }
  pLVar1 = (config->bwinfo).ptr_;
  if (pLVar1 != (LockedIsacBandwidthInfo *)0x0) {
    LOCK();
    pLVar1->ref_count_ = pLVar1->ref_count_ + 1;
    UNLOCK();
  }
  pLVar2 = (this->config_).bwinfo.ptr_;
  if (pLVar2 != (LockedIsacBandwidthInfo *)0x0) {
    LockedIsacBandwidthInfo::Release(pLVar2);
  }
  (this->config_).bwinfo.ptr_ = pLVar1;
  iVar9 = config->sample_rate_hz;
  iVar5 = config->frame_size_ms;
  iVar6 = config->bit_rate;
  uVar3 = *(undefined8 *)((long)&config->frame_size_ms + 2);
  uVar4 = *(undefined8 *)((long)&config->max_payload_size_bytes + 2);
  (this->config_).payload_type = config->payload_type;
  (this->config_).sample_rate_hz = iVar9;
  (this->config_).frame_size_ms = iVar5;
  (this->config_).bit_rate = iVar6;
  *(undefined8 *)((long)&(this->config_).frame_size_ms + 2) = uVar3;
  *(undefined8 *)((long)&(this->config_).max_payload_size_bytes + 2) = uVar4;
  return;
}

Assistant:

void AudioEncoderIsacT<T>::RecreateEncoderInstance(const Config& config) {
  RTC_CHECK(config.IsOk());
  packet_in_progress_ = false;
  bwinfo_ = config.bwinfo;
  if (isac_state_)
    RTC_CHECK_EQ(0, T::Free(isac_state_));
  RTC_CHECK_EQ(0, T::Create(&isac_state_));
  RTC_CHECK_EQ(0, T::EncoderInit(isac_state_, config.adaptive_mode ? 0 : 1));
  RTC_CHECK_EQ(0, T::SetEncSampRate(isac_state_, config.sample_rate_hz));
  const int bit_rate = config.bit_rate == 0 ? kDefaultBitRate : config.bit_rate;
  if (config.adaptive_mode) {
    RTC_CHECK_EQ(0, T::ControlBwe(isac_state_, bit_rate, config.frame_size_ms,
                                  config.enforce_frame_size));
  } else {
    RTC_CHECK_EQ(0, T::Control(isac_state_, bit_rate, config.frame_size_ms));
  }
  if (config.max_payload_size_bytes != -1)
    RTC_CHECK_EQ(
        0, T::SetMaxPayloadSize(isac_state_, config.max_payload_size_bytes));
  if (config.max_bit_rate != -1)
    RTC_CHECK_EQ(0, T::SetMaxRate(isac_state_, config.max_bit_rate));

  // Set the decoder sample rate even though we just use the encoder. This
  // doesn't appear to be necessary to produce a valid encoding, but without it
  // we get an encoding that isn't bit-for-bit identical with what a combined
  // encoder+decoder object produces.
  RTC_CHECK_EQ(0, T::SetDecSampRate(isac_state_, config.sample_rate_hz));

  config_ = config;
}